

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O0

int handlesbginterfacecli(SOCKET sockcli,void *pParam)

{
  SOCKET SVar1;
  int iVar2;
  fd_set *__arr;
  undefined1 auStack_3d0 [4];
  uint __i;
  timeval tv;
  undefined1 local_3b8 [4];
  int iResult;
  fd_set sock_set;
  RS232PORT SBGInterfacePseudoRS232Port_tmp;
  int timeout;
  void *pParam_local;
  SOCKET sockcli_local;
  
  memcpy(sock_set.fds_bits + 0xf,&SBGInterfacePseudoRS232Port,0x318);
  inithandlesbginterface((RS232PORT *)(sock_set.fds_bits + 0xf));
  while( true ) {
    tv.tv_usec._4_4_ = 0xffffffff;
    if (bExit != 0) {
      return 0;
    }
    _auStack_3d0 = 0;
    tv.tv_sec = 5000;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)(local_3b8 + (ulong)__arr._4_4_ * 8) = 0;
    }
    iVar2 = sockcli;
    if (sockcli < 0) {
      iVar2 = sockcli + 0x3f;
    }
    *(ulong *)(local_3b8 + (long)(iVar2 >> 6) * 8) =
         *(ulong *)(local_3b8 + (long)(iVar2 >> 6) * 8) | 1L << ((ulong)(byte)sockcli & 0x3f);
    tv.tv_usec._4_4_ =
         select(sockcli + 1,(fd_set *)0x0,(fd_set *)local_3b8,(fd_set *)0x0,(timeval *)auStack_3d0);
    SVar1 = sockcli;
    if (sockcli < 0) {
      SVar1 = sockcli + 0x3f;
    }
    *(ulong *)(local_3b8 + (long)(SVar1 >> 6) * 8) =
         *(ulong *)(local_3b8 + (long)(SVar1 >> 6) * 8) & ~(1L << ((ulong)(byte)sockcli & 0x3f));
    if (tv.tv_usec._4_4_ == -1) break;
    if ((tv.tv_usec._4_4_ != 0) &&
       (iVar2 = handlesbginterface((RS232PORT *)(sock_set.fds_bits + 0xf)), iVar2 != 0)) {
      return 1;
    }
    if (bExit != 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int handlesbginterfacecli(SOCKET sockcli, void* pParam)
{
	int timeout = 5;
	RS232PORT SBGInterfacePseudoRS232Port_tmp = SBGInterfacePseudoRS232Port;

	UNREFERENCED_PARAMETER(pParam);

	// Not thread-safe...

	if (SBGInterfacePseudoRS232Port_tmp.DevType == TCP_SERVER_TYPE_RS232PORT) SBGInterfacePseudoRS232Port_tmp.s = sockcli;
				
	inithandlesbginterface(&SBGInterfacePseudoRS232Port_tmp);

	for (;;)
	{
		fd_set sock_set;
		int iResult = SOCKET_ERROR;
		struct timeval tv;

		if (bExit) break;

		tv.tv_sec = (long)(timeout/1000);
		tv.tv_usec = (long)((timeout%1000)*1000);

		// Initialize a fd_set and add the socket to it.
		FD_ZERO(&sock_set); 
		FD_SET(sockcli, &sock_set);

		iResult = select((int)sockcli+1, NULL, &sock_set, NULL, &tv);

		// Remove the socket from the set.
		// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
		// sufficient to know what happened.
		FD_CLR(sockcli, &sock_set); 

		switch (iResult)
		{
		case SOCKET_ERROR:
			return EXIT_FAILURE;
		case 0:
			// The timeout on select() occured.
			break;
		default:
			if (handlesbginterface(&SBGInterfacePseudoRS232Port_tmp) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			break;
		}

		if (bExit) break;
	}

	return EXIT_SUCCESS;
}